

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcEquipmentStandard::IfcEquipmentStandard(IfcEquipmentStandard *this)

{
  IfcEquipmentStandard *this_local;
  
  STEP::Object::Object((Object *)&(this->super_IfcControl).field_0xf0,"IfcEquipmentStandard");
  IfcControl::IfcControl(&this->super_IfcControl,&PTR_construction_vtable_24__00f61060);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEquipmentStandard,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcEquipmentStandard,_0UL> *)
             &(this->super_IfcControl).super_IfcObject.field_0xe0,
             &PTR_construction_vtable_24__00f61110);
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject = 0xf60f80;
  *(undefined8 *)&(this->super_IfcControl).field_0xf0 = 0xf61048;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0x88 = 0xf60fa8;
  (this->super_IfcControl).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xf60fd0;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0xd0 = 0xf60ff8;
  *(undefined8 *)&(this->super_IfcControl).super_IfcObject.field_0xe0 = 0xf61020;
  return;
}

Assistant:

IfcEquipmentStandard() : Object("IfcEquipmentStandard") {}